

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O1

void * spng_get_png_buffer(spng_ctx *ctx,size_t *len,int *error)

{
  spng_state sVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  
  bVar2 = len == (size_t *)0x0 || ctx == (spng_ctx *)0x0;
  uVar3 = (uint)bVar2;
  if (error != (int *)0x0) {
    *error = (uint)bVar2;
    uVar3 = 0;
  }
  if (bVar2) {
    return (void *)0x0;
  }
  if ((*(ushort *)&ctx->field_0xcc & 0x10) == 0) {
    iVar4 = 0x51;
    uVar5 = 0x51;
LAB_00108606:
    if (error == (int *)0x0) goto LAB_00108610;
  }
  else {
    sVar1 = ctx->state;
    if (sVar1 == SPNG_STATE_INVALID) {
      iVar4 = 0x46;
      uVar5 = 0x46;
      goto LAB_00108606;
    }
    if (((*(ushort *)&ctx->field_0xcc & 2) == 0) || (sVar1 < SPNG_STATE_EOI)) {
      iVar4 = 0x54;
      uVar5 = 0x54;
      goto LAB_00108606;
    }
    iVar4 = 0x55;
    uVar5 = 0x55;
    if (sVar1 == SPNG_STATE_IEND) {
      uVar5 = uVar3;
    }
    if (sVar1 == SPNG_STATE_IEND || error == (int *)0x0) goto LAB_00108610;
  }
  *error = iVar4;
  uVar5 = uVar3;
LAB_00108610:
  if (error != (int *)0x0) {
    uVar5 = *error;
  }
  if (uVar5 != 0) {
    return (void *)0x0;
  }
  ctx->user_owns_out_png = 1;
  *len = ctx->bytes_encoded;
  return ctx->out_png;
}

Assistant:

void *spng_get_png_buffer(spng_ctx *ctx, size_t *len, int *error)
{
    int tmp = 0;
    error = error ? error : &tmp;
    *error = 0;

    if(ctx == NULL || !len) *error = SPNG_EINVAL;

    if(*error) return NULL;

    if(!ctx->encode_only) *error = SPNG_ECTXTYPE;
    else if(!ctx->state) *error = SPNG_EBADSTATE;
    else if(!ctx->internal_buffer) *error = SPNG_EOPSTATE;
    else if(ctx->state < SPNG_STATE_EOI) *error = SPNG_EOPSTATE;
    else if(ctx->state != SPNG_STATE_IEND) *error = SPNG_ENOTFINAL;

    if(*error) return NULL;

    ctx->user_owns_out_png = 1;

    *len = ctx->bytes_encoded;

    return ctx->out_png;
}